

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  StorageKind SVar1;
  Module *pMVar2;
  Module *module;
  undefined1 auVar3 [16];
  Name memory;
  variant<wasm::Name,_wasm::HeapType> value;
  variant<wasm::Name,_wasm::HeapType> value_00;
  Name name_00;
  undefined4 index;
  Store *pSVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  reference pvVar8;
  pointer pMVar9;
  address64_t aVar10;
  pointer pFVar11;
  Type type;
  Const *pCVar12;
  GlobalGet *value_01;
  Break *any;
  LocalGet *left;
  Load *value_02;
  Store *pSVar13;
  LocalSet *args;
  Break *args_1;
  Loop *first;
  LocalGet *pLVar14;
  Binary *pBVar15;
  If *left_00;
  Block *pBVar16;
  pointer pEVar17;
  Name NVar18;
  Name name_01;
  Name name_02;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  Name name_03;
  pointer local_490;
  string_view local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  string_view local_380;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_370;
  reference local_368;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  undefined8 uStack_340;
  bool memoryExported;
  undefined8 uStack_338;
  undefined8 local_330;
  string_view local_328;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_318 [2];
  undefined1 local_308 [2] [12];
  undefined1 local_2f0 [2] [12];
  undefined1 local_2d8 [12];
  string_view local_2c8;
  size_t local_2b8;
  char *pcStack_2b0;
  Type local_2a0;
  size_t local_298;
  size_t sStack_290;
  Type local_280;
  Address local_278;
  Address local_270;
  string_view local_268;
  string_view local_258;
  string_view local_248;
  size_t sStack_238;
  Name loadMemoryName;
  anon_class_16_2_204a708a getFuncIdx;
  Name local_210;
  undefined1 local_1fc [8];
  Index funcIdxVar;
  char *pcStack_1f0;
  Type local_1e8;
  Type local_1e0;
  size_t local_1d8;
  char *pcStack_1d0;
  Address local_1c8;
  reference local_1c0;
  Name *global;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range3;
  uint32_t offset;
  Type local_180;
  Address local_178;
  Store *local_170;
  Expression *writeData;
  anon_class_16_2_22e62c78 profileSizeConst;
  anon_class_16_2_29deed5a hashConst;
  anon_class_8_1_911e227b getSize;
  anon_class_16_2_a93e66f6 getAddr;
  Builder builder;
  Name local_118;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_108;
  Type local_f0;
  char *local_e8;
  Type local_e0;
  char **local_d8;
  undefined8 local_d0;
  Type local_c8;
  Signature local_c0;
  HeapType local_b0;
  char *local_a8;
  HeapType HStack_a0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_98;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  undefined1 auStack_80 [8];
  Name name;
  Type ptrType;
  Type local_58;
  bool local_50 [8];
  Address local_48;
  Name local_40;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_30;
  ulong local_28;
  size_t pages;
  size_t profileSize;
  size_t numFuncs_local;
  Instrumenter *this_local;
  
  pages = numFuncs * 4 + 8;
  local_28 = numFuncs * 4 + 0x10007 >> 0x10;
  profileSize = numFuncs;
  numFuncs_local = (size_t)this;
  bVar6 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&this->wasm->memories);
  if (bVar6) {
    pMVar2 = this->wasm;
    Name::Name(&local_40,"0");
    Address::Address(&local_48,0);
    Address::Address((Address *)local_50,0x10000);
    Type::Type(&local_58,i32);
    name_01.super_IString.str._M_str = (char *)local_40.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&local_30;
    Builder::makeMemory(name_01,(Address)local_40.super_IString.str._M_str,local_48,local_50[0],
                        (Type)0x0);
    ::wasm::Module::addMemory((unique_ptr *)pMVar2);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_30);
    uVar5 = local_28;
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    Address::operator=(&pMVar9->initial,uVar5);
    uVar5 = local_28;
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    Address::operator=(&pMVar9->max,uVar5);
  }
  else {
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    aVar10 = Address::operator_cast_to_unsigned_long(&pMVar9->initial);
    uVar5 = local_28;
    if (aVar10 < local_28) {
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      Address::operator=(&pMVar9->initial,uVar5);
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      aVar10 = Address::operator_cast_to_unsigned_long(&pMVar9->max);
      uVar5 = local_28;
      if (aVar10 < local_28) {
        pvVar8 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar8);
        Address::operator=(&pMVar9->max,uVar5);
      }
    }
  }
  pvVar8 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&this->wasm->memories,0);
  pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
  name.super_IString.str._M_str = (char *)(pMVar9->addressType).id;
  pMVar2 = this->wasm;
  Name::Name((Name *)&writeProfile,&this->config->profileExport);
  _auStack_80 = (string_view)Names::getValidFunctionName(pMVar2,(Name)_writeProfile);
  local_a8 = (char *)auStack_80;
  HStack_a0.id = name.super_IString.str._M_len;
  local_e8 = name.super_IString.str._M_str;
  Type::Type(&local_e0,i32);
  local_d8 = &local_e8;
  local_d0 = 2;
  ::wasm::Type::Type(&local_c8,local_d8,2);
  Type::Type(&local_f0,i32);
  Signature::Signature(&local_c0,local_c8,local_f0);
  ::wasm::HeapType::HeapType(&local_b0,local_c0);
  local_108.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_108);
  name_02.super_IString.str._M_str = local_a8;
  name_02.super_IString.str._M_len = (size_t)&local_98;
  Builder::makeFunction
            (name_02,HStack_a0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0.id,
             (Expression *)&local_108);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_108);
  pFVar11 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                      (&local_98);
  (pFVar11->super_Importable).super_Named.hasExplicitName = true;
  pFVar11 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                      (&local_98);
  Name::Name(&local_118,"addr");
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_118.super_IString.str._M_len;
  ::wasm::Function::setLocalName((uint)pFVar11,(Name)(auVar3 << 0x40));
  pFVar11 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                      (&local_98);
  Name::Name((Name *)&builder,"size");
  NVar18.super_IString.str._M_str = (char *)builder.wasm;
  NVar18.super_IString.str._M_len = 1;
  ::wasm::Function::setLocalName((uint)pFVar11,NVar18);
  Builder::Builder((Builder *)&getAddr.ptrType,this->wasm);
  writeData = (Expression *)&getAddr.ptrType;
  getAddr.builder = (Builder *)&name.super_IString.str._M_str;
  profileSizeConst.builder = (Builder *)&pages;
  profileSizeConst.profileSize = (size_t *)writeData;
  hashConst.builder = (Builder *)this;
  hashConst.this = (Instrumenter *)writeData;
  getSize.builder = (Builder *)writeData;
  Address::Address(&local_178,0);
  type.id = (uintptr_t)
            addProfileExport::anon_class_16_2_a93e66f6::operator()
                      ((anon_class_16_2_a93e66f6 *)&getSize);
  pCVar12 = addProfileExport::anon_class_16_2_29deed5a::operator()
                      ((anon_class_16_2_29deed5a *)&profileSizeConst.profileSize);
  Type::Type(&local_180,i64);
  pvVar8 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&this->wasm->memories,0);
  pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
  local_170 = Builder::makeStore((Builder *)&getAddr.ptrType,8,local_178,1,(Expression *)type.id,
                                 (Expression *)pCVar12,local_180,
                                 (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str
                                );
  __range3._4_4_ = 8;
  SVar1 = this->config->storageKind;
  if (SVar1 == InGlobals) {
    __end3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(&this->functionGlobals);
    global = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                               (&this->functionGlobals);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                       *)&global), bVar6) {
      local_1c0 = __gnu_cxx::
                  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                  ::operator*(&__end3);
      pSVar4 = local_170;
      Address::Address(&local_1c8,(ulong)__range3._4_4_);
      pLVar14 = addProfileExport::anon_class_16_2_a93e66f6::operator()
                          ((anon_class_16_2_a93e66f6 *)&getSize);
      local_1d8 = (local_1c0->super_IString).str._M_len;
      pcStack_1d0 = (local_1c0->super_IString).str._M_str;
      Type::Type(&local_1e0,i32);
      name_00.super_IString.str._M_str = pcStack_1d0;
      name_00.super_IString.str._M_len = local_1d8;
      value_01 = Builder::makeGlobalGet((Builder *)&getAddr.ptrType,name_00,local_1e0);
      Type::Type(&local_1e8,i32);
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      unique0x10000e3c = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_1f0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      pSVar13 = Builder::makeStore((Builder *)&getAddr.ptrType,4,local_1c8,1,(Expression *)pLVar14,
                                   (Expression *)value_01,local_1e8,
                                   (Name)(pMVar9->super_Importable).super_Named.name.super_IString.
                                         str);
      local_170 = (Store *)Builder::blockify((Builder *)&getAddr.ptrType,(Expression *)pSVar4,
                                             (Expression *)pSVar13);
      __range3._4_4_ = __range3._4_4_ + 4;
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end3);
    }
  }
  else if (SVar1 - InMemory < 2) {
    pFVar11 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_98);
    Name::Name(&local_210,"funcIdx");
    Type::Type((Type *)&getFuncIdx.funcIdxVar,i32);
    name_03.super_IString.str._M_str = (char *)getFuncIdx.funcIdxVar;
    name_03.super_IString.str._M_len = (size_t)local_210.super_IString.str._M_str;
    local_1fc._0_4_ =
         Builder::addVar((Builder *)pFVar11,(Function *)local_210.super_IString.str._M_len,name_03,
                         type);
    loadMemoryName.super_IString.str._M_str = (char *)&getAddr.ptrType;
    getFuncIdx.builder = (Builder *)local_1fc;
    if (this->config->storageKind == InMemory) {
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      local_490 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                            (pvVar8);
    }
    else {
      local_490 = (pointer)&this->secondaryMemory;
    }
    pSVar4 = local_170;
    sStack_238 = (local_490->super_Importable).super_Named.name.super_IString.str._M_len;
    loadMemoryName.super_IString.str._M_len =
         (size_t)(local_490->super_Importable).super_Named.name.super_IString.str._M_str;
    Name::Name((Name *)&local_248,"outer");
    Name::Name((Name *)&local_258,"l");
    Name::Name((Name *)&local_268,"outer");
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getAddr.ptrType,(uint)profileSize);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr.ptrType,EqInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    any = Builder::makeBreak((Builder *)&getAddr.ptrType,(Name)local_268,(Expression *)0x0,
                             (Expression *)pBVar15);
    Address::Address(&local_270,8);
    pLVar14 = addProfileExport::anon_class_16_2_a93e66f6::operator()
                        ((anon_class_16_2_a93e66f6 *)&getSize);
    left = addProfileExport::anon_class_16_2_204a708a::operator()
                     ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getAddr.ptrType,4);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr.ptrType,MulInt32,(Expression *)left,
                                  (Expression *)pCVar12);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr.ptrType,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pBVar15);
    Address::Address(&local_278,0);
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    Type::Type(&local_280,i32);
    local_298 = sStack_238;
    sStack_290 = loadMemoryName.super_IString.str._M_len;
    memory.super_IString.str._M_str = (char *)loadMemoryName.super_IString.str._M_len;
    memory.super_IString.str._M_len = sStack_238;
    value_02 = Builder::makeAtomicLoad
                         ((Builder *)&getAddr.ptrType,1,local_278,(Expression *)pLVar14,local_280,
                          memory);
    Type::Type(&local_2a0,i32);
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    local_2b8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_2b0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    pSVar13 = Builder::makeStore((Builder *)&getAddr.ptrType,4,local_270,4,(Expression *)pBVar15,
                                 (Expression *)value_02,local_2a0,
                                 (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str
                                );
    index = local_1fc._0_4_;
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getAddr.ptrType,1);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr.ptrType,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    args = Builder::makeLocalSet((Builder *)&getAddr.ptrType,index,(Expression *)pBVar15);
    Name::Name((Name *)&local_2c8,"l");
    args_1 = Builder::makeBreak((Builder *)&getAddr.ptrType,(Name)local_2c8,(Expression *)0x0,
                                (Expression *)0x0);
    pBVar16 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        ((Builder *)&getAddr.ptrType,(Expression *)any,(Expression *)pSVar13,args,
                         args_1);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_2d8);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_2d8._0_8_;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2d8[8];
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_2d8._9_3_;
    first = Builder::makeLoop((Builder *)&getAddr.ptrType,(Name)local_258,(Expression *)pBVar16,
                              type_00);
    pBVar16 = Builder::makeBlock((Builder *)&getAddr.ptrType,(Name)local_248,(Expression *)first);
    local_170 = (Store *)Builder::blockify((Builder *)&getAddr.ptrType,(Expression *)pSVar4,
                                           (Expression *)pBVar16);
  }
  pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()
                      ((anon_class_8_1_911e227b *)&hashConst.this);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&writeData);
  pBVar15 = Builder::makeBinary((Builder *)&getAddr.ptrType,GeUInt32,(Expression *)pLVar14,
                                (Expression *)pCVar12);
  pSVar4 = local_170;
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_2f0);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)local_2f0[0]._0_8_;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2f0[0][8];
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_2f0[0]._9_3_;
  left_00 = Builder::makeIf((Builder *)&getAddr.ptrType,(Expression *)pBVar15,(Expression *)pSVar4,
                            (Expression *)0x0,type_01);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&writeData);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_308);
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)local_308[0]._0_8_;
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_308[0][8];
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_308[0]._9_3_;
  pBVar16 = Builder::makeSequence
                      ((Builder *)&getAddr.ptrType,(Expression *)left_00,(Expression *)pCVar12,
                       type_02);
  pFVar11 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                      (&local_98);
  pFVar11->body = (Expression *)pBVar16;
  ::wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar2 = this->wasm;
  Name::Name((Name *)&local_328,&this->config->profileExport);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&stack0xfffffffffffffcc0,(Name *)auStack_80);
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_338;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = uStack_340;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_330;
  Builder::makeExport((Builder *)local_318,(Name)local_328,value,Function);
  ::wasm::Module::addExport((unique_ptr *)pMVar2);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(local_318);
  pvVar8 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&this->wasm->memories,0);
  pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
  bVar6 = Importable::imported(&pMVar9->super_Importable);
  if (!bVar6) {
    bVar6 = false;
    pMVar2 = this->wasm;
    __end2 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&pMVar2->exports);
    ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end(&pMVar2->exports);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                       *)&ex), bVar7) {
      local_368 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                  ::operator*(&__end2);
      pEVar17 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                          (local_368);
      if (pEVar17->kind == Memory) {
        bVar6 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar6) {
      pMVar2 = this->wasm;
      Name::Name((Name *)&local_380,"profile-memory");
      module = this->wasm;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&module->memories,0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_3a8 = (string_view)
                  Names::getValidExportName
                            (module,(Name)(pMVar9->super_Importable).super_Named.name.super_IString.
                                          str);
      std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
                ((variant<wasm::Name,wasm::HeapType> *)&local_398,(Name *)&local_3a8);
      value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_str = (char *)uStack_390;
      value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_len = local_398;
      value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_388;
      Builder::makeExport((Builder *)&local_370,(Name)local_380,value_00,Memory);
      ::wasm::Module::addExport((unique_ptr *)pMVar2);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_370);
    }
  }
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_98);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  auto ptrType = wasm->memories[0]->addressType;

  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile =
    Builder::makeFunction(name, Signature({ptrType, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, ptrType); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}